

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

ContNew * __thiscall wasm::Builder::makeContNew(Builder *this,HeapType type,Expression *func)

{
  ContNew *this_00;
  
  this_00 = (ContNew *)MixedArena::allocSpace(&this->wasm->allocator,0x18,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)90>).super_Expression._id = ContNewId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)90>).super_Expression.type.id = 0;
  if (((uint)(0x7c < type.id) * 4 + 3 & (uint)type.id) == 0) {
    (this_00->super_SpecificExpression<(wasm::Expression::Id)90>).super_Expression.type.id = type.id
    ;
    this_00->func = func;
    ContNew::finalize(this_00);
    return this_00;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

ContNew* makeContNew(HeapType type, Expression* func) {
    auto* ret = wasm.allocator.alloc<ContNew>();
    ret->type = Type(type, NonNullable);
    ret->func = func;
    ret->finalize();
    return ret;
  }